

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O2

void FDynamicColormap::RebuildAllLights(void)

{
  int iVar1;
  BYTE *pBVar2;
  FDynamicColormap *cm;
  FDynamicColormap *this;
  
  iVar1 = (*Renderer->_vptr_FRenderer[2])();
  if ((char)iVar1 != '\0') {
    for (this = &NormalLight; this != (FDynamicColormap *)0x0; this = this->Next) {
      if (this->Maps == (BYTE *)0x0) {
        pBVar2 = (BYTE *)operator_new__(0x2000);
        this->Maps = pBVar2;
        BuildLights(this);
      }
    }
  }
  return;
}

Assistant:

void FDynamicColormap::RebuildAllLights()
{
	if (Renderer->UsesColormap())
	{
		FDynamicColormap *cm;

		for (cm = &NormalLight; cm != NULL; cm = cm->Next)
		{
			if (cm->Maps == NULL)
			{
				cm->Maps = new BYTE[NUMCOLORMAPS*256];
				cm->BuildLights ();
			}
		}
	}
}